

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fillpoints.cc
# Opt level: O1

void re2c::scc(dfa_t *dfa,
              stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
              *stack,vector<unsigned_long,_std::allocator<unsigned_long>_> *lowlink,
              vector<bool,_std::allocator<bool>_> *trivial,size_t i)

{
  _Map_pointer ppuVar1;
  size_t *psVar2;
  size_t i_00;
  pointer puVar3;
  _Bit_type *p_Var4;
  unsigned_long uVar5;
  long lVar6;
  _Elt_pointer puVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *lowlink_00;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  size_t local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_48;
  vector<bool,_std::allocator<bool>_> *local_40;
  unsigned_long local_38;
  
  ppuVar1 = (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  puVar7 = (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  local_38 = ((long)(stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_last -
              (long)(stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
             ((long)puVar7 -
              (long)(stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
             ((((ulong)((long)ppuVar1 -
                       (long)(stack->c).
                             super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x40;
  (lowlink->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[i] = local_38;
  local_50 = i;
  local_48 = lowlink;
  local_40 = trivial;
  if (puVar7 == (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<unsigned_long,std::allocator<unsigned_long>>::_M_push_back_aux<unsigned_long_const&>
              ((deque<unsigned_long,std::allocator<unsigned_long>> *)stack,&local_50);
  }
  else {
    *puVar7 = i;
    (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = puVar7 + 1;
  }
  uVar10 = dfa->nchars;
  psVar2 = (dfa->states).
           super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
           super__Vector_impl_data._M_start[local_50]->arcs;
  lowlink_00 = local_48;
  if (uVar10 != 0) {
    uVar8 = 0;
    do {
      i_00 = psVar2[uVar8];
      if (i_00 != 0xffffffffffffffff) {
        if ((lowlink_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[i_00] == 0xfffffffffffffffe) {
          scc(dfa,stack,lowlink_00,local_40,i_00);
          lowlink_00 = local_48;
        }
        puVar3 = (lowlink_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if (puVar3[i_00] < puVar3[local_50]) {
          puVar3[local_50] = puVar3[i_00];
        }
      }
      uVar8 = uVar8 + 1;
      uVar10 = dfa->nchars;
    } while (uVar8 < uVar10);
  }
  if ((lowlink_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[local_50] == local_38) {
    puVar7 = (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (puVar7 == (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
      puVar7 = (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if (local_50 == puVar7[-1]) {
      bVar11 = uVar10 != 0;
      if ((bVar11) && (*psVar2 != local_50)) {
        uVar8 = 1;
        do {
          uVar9 = uVar8;
          if (uVar10 == uVar9) break;
          uVar8 = uVar9 + 1;
        } while (psVar2[uVar9] != local_50);
        bVar11 = uVar9 < uVar10;
      }
      bVar11 = (bool)(bVar11 ^ 1);
    }
    else {
      bVar11 = false;
    }
    uVar10 = local_50 + 0x3f;
    if (-1 < (long)local_50) {
      uVar10 = local_50;
    }
    lVar6 = (long)uVar10 >> 6;
    p_Var4 = (local_40->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p;
    uVar8 = (ulong)((local_50 & 0x800000000000003f) < 0x8000000000000001);
    uVar10 = 1L << ((byte)local_50 & 0x3f);
    if (bVar11) {
      uVar10 = uVar10 | p_Var4[lVar6 + uVar8 + 0xffffffffffffffff];
    }
    else {
      uVar10 = ~uVar10 & p_Var4[lVar6 + uVar8 + 0xffffffffffffffff];
    }
    p_Var4[lVar6 + uVar8 + 0xffffffffffffffff] = uVar10;
    do {
      puVar7 = (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (puVar7 == (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first) {
        puVar7 = (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      uVar5 = puVar7[-1];
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&stack->c);
      (local_48->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar5] = 0xffffffffffffffff;
    } while (uVar5 != local_50);
  }
  return;
}

Assistant:

static void scc(
	const dfa_t &dfa,
	std::stack<size_t> &stack,
	std::vector<size_t> &lowlink,
	std::vector<bool> &trivial,
	size_t i)
{
	const size_t link = stack.size();
	lowlink[i] = link;
	stack.push(i);

	const size_t *arcs = dfa.states[i]->arcs;
	for (size_t c = 0; c < dfa.nchars; ++c)
	{
		const size_t j = arcs[c];
		if (j != dfa_t::NIL)
		{
			if (lowlink[j] == UNDEFINED)
			{
				scc(dfa, stack, lowlink, trivial, j);
			}
			if (lowlink[j] < lowlink[i])
			{
				lowlink[i] = lowlink[j];
			}
		}
	}

	if (lowlink[i] == link)
	{
		// SCC is non-trivial (has loops) iff it either:
		//   - consists of multiple nodes (they all must be interconnected)
		//   - consists of single node which loops back to itself
		trivial[i] = i == stack.top()
			&& !loopback(i, dfa.nchars, arcs);

		size_t j;
		do
		{
			j = stack.top();
			stack.pop();
			lowlink[j] = INFINITI;
		}
		while (j != i);
	}
}